

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

void nn_req_term(nn_req *self)

{
  long in_RDI;
  
  nn_timer_term((nn_timer *)0x12e52c);
  nn_task_term((nn_task *)(in_RDI + 0x388));
  nn_msg_term((nn_msg *)0x12e550);
  nn_msg_term((nn_msg *)0x12e564);
  nn_fsm_term((nn_fsm *)0x12e574);
  nn_xreq_term((nn_xreq *)0x12e57d);
  return;
}

Assistant:

void nn_req_term (struct nn_req *self)
{
    nn_timer_term (&self->task.timer);
    nn_task_term (&self->task);
    nn_msg_term (&self->task.reply);
    nn_msg_term (&self->task.request);
    nn_fsm_term (&self->fsm);
    nn_xreq_term (&self->xreq);
}